

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int dmy_to_mjd2000(int D,int M,int Y,int *mjd2000)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int the_date;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar3 = dmy_to_mjd2000_julian(D,M,Y,&local_40);
  iVar6 = -1;
  if (iVar3 != 0) {
    return -1;
  }
  if (local_40 < 0x240786) {
    iVar3 = local_40 + -0x256859;
LAB_0015f4de:
    *mjd2000 = iVar3;
    iVar6 = 0;
  }
  else {
    if (((0 < D) && (Y != 0)) && (0xfffffff3 < M - 0xdU)) {
      iVar1 = *(int *)(&DAT_001b6cb0 + (ulong)(M - 1) * 4);
      uVar4 = 0;
      if (M == 2) {
        uVar4 = Y - (Y >> 0x1f);
        uVar5 = uVar4 * -0x3d70a3d7 + 0x51eb850;
        uVar4 = (uint)((uVar5 >> 4 | uVar4 * -0x70000000) < 0xa3d70b !=
                      ((uVar5 >> 2 | uVar4 * 0x40000000) < 0x28f5c29 != ((uVar4 & 3) == 0)));
      }
      if (D <= (int)((*(int *)(&DAT_001b6cb0 + (ulong)(uint)M * 4) - iVar1) + uVar4)) {
        iVar3 = -(Y >> 0x1f);
        uVar4 = iVar3 + Y;
        local_34 = uVar4 * 0x16d;
        uVar5 = iVar3 + Y + 3;
        if (-1 < (int)uVar4) {
          uVar5 = uVar4;
        }
        local_38 = (int)uVar5 >> 2;
        iVar2 = (int)((ulong)((long)(int)uVar4 * -0x51eb851f) >> 0x20);
        iVar3 = 0;
        if (M < 3) {
          iVar3 = -(uint)((uint)((uVar4 & 3) == 0) - (uint)((int)uVar4 % 100 == 0) !=
                         -(uint)((int)uVar4 % 400 == 0));
          local_3c = iVar1;
        }
        iVar3 = iVar3 + (((int)(uVar4 - (uVar5 & 0xfffffffc)) >> 0x1f) - ((int)uVar4 % 100 >> 0x1f))
                        + ((iVar2 >> 5) - (iVar2 >> 0x1f)) + local_38 + (int)uVar4 / 400 + D +
                          local_34 + ((int)uVar4 % 400 >> 0x1f) + iVar1;
        local_40 = iVar3 + -0x8d7df;
        if (0xecc2 < local_40) {
          iVar3 = iVar3 + -0xb2575;
          goto LAB_0015f4de;
        }
      }
    }
    coda_set_error(-0x68,"invalid date/time argument (%02d-%02d-%04d)",D,(ulong)(uint)M,
                   (ulong)(uint)Y);
  }
  return iVar6;
}

Assistant:

static int dmy_to_mjd2000(int D, int M, int Y, int *mjd2000)
{
    const int TD = 2;
    const int TM = 9;
    const int TY = 1752;
    int transition;
    int the_date;

    if (dmy_to_mjd2000_julian(D, M, Y, &the_date) != 0 || dmy_to_mjd2000_julian(TD, TM, TY, &transition) != 0)
    {
        return -1;
    }

    if (the_date <= transition)
    {
        /* Julian calendar regime */
        *mjd2000 = the_date - 2451545;
    }
    else
    {
        /* Gregorian calendar regime */
        if (dmy_to_mjd2000_gregorian(D, M, Y, &the_date) != 0)
        {
            return -1;
        }

        if (the_date - 150934 <= transition - 2451545)
        {
            coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid date/time argument (%02d-%02d-%04d)", D, M, Y);
            return -1;
        }

        *mjd2000 = the_date - 150934;
    }

    return 0;
}